

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O3

void __thiscall
spvtools::opt::FixStorageClass::ChangeResultStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  DefUseManager *this_01;
  Analysis AVar2;
  uint32_t uVar3;
  Instruction *this_02;
  uint uVar4;
  IRContext *this_03;
  undefined1 local_50 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_30;
  
  pIVar1 = (this->super_Pass).context_;
  AVar2 = pIVar1->valid_analyses_;
  this_03 = pIVar1;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(pIVar1);
    this_03 = (this->super_Pass).context_;
    AVar2 = this_03->valid_analyses_;
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_03);
  }
  this_01 = (this_03->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar3 = 0;
  if (inst->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(inst,0);
  }
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar3);
  if (this_02->opcode_ == OpTypePointer) {
    uVar4 = (this_02->has_result_id_ & 1) + 1;
    if (this_02->has_type_id_ == false) {
      uVar4 = (uint)this_02->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_02,uVar4 + 1);
    local_50._16_4_ = analysis::TypeManager::FindPointerToType(this_00,uVar3,storage_class);
    if (inst->has_type_id_ != false) {
      if ((_Type)local_50._16_4_ != (_Type)0x0) {
        local_50._24_8_ = local_50 + 0x10;
        local_50._0_8_ = &PTR__SmallVector_00930a20;
        local_30._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_50._8_8_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&((inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start)->words,
                   (SmallVector<unsigned_int,_2UL> *)local_50);
        local_50._0_8_ = &PTR__SmallVector_00930a20;
        if (local_30._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_30,local_30._M_head_impl);
        }
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
          analysis::DefUseManager::UpdateDefUse
                    ((pIVar1->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,inst);
        }
        return;
      }
      __assert_fail("ty_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    __assert_fail("has_type_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
  }
  __assert_fail("result_type_inst->opcode() == spv::Op::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                ,0x87,
                "void spvtools::opt::FixStorageClass::ChangeResultStorageClass(Instruction *, spv::StorageClass) const"
               );
}

Assistant:

void FixStorageClass::ChangeResultStorageClass(
    Instruction* inst, spv::StorageClass storage_class) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  Instruction* result_type_inst = get_def_use_mgr()->GetDef(inst->type_id());
  assert(result_type_inst->opcode() == spv::Op::OpTypePointer);
  uint32_t pointee_type_id = result_type_inst->GetSingleWordInOperand(1);
  uint32_t new_result_type_id =
      type_mgr->FindPointerToType(pointee_type_id, storage_class);
  inst->SetResultType(new_result_type_id);
  context()->UpdateDefUse(inst);
}